

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::GL>::
Cleanup(CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::GL> *this_local;
  
  DisablePrimitiveRestart(this);
  glu::CallLogWrapper::glDisableVertexAttribArray
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->_program);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_buffer);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_ebo);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_bufferIndirect);
  return 0;
}

Assistant:

virtual long Cleanup()
	{

		DisablePrimitiveRestart();
		glDisableVertexAttribArray(0);
		glUseProgram(0);
		glDeleteProgram(_program);
		glDeleteVertexArrays(1, &_vao);
		glDeleteBuffers(1, &_buffer);
		glDeleteBuffers(1, &_ebo);
		glDeleteBuffers(1, &_bufferIndirect);
		return NO_ERROR;
	}